

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_graph_print(ggml_cgraph *cgraph)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  char *pcVar4;
  ggml_tensor *pgVar5;
  char *pcVar6;
  ulong uVar7;
  
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"=== GRAPH ===\n");
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"n_nodes = %d\n",(ulong)(uint)cgraph->n_nodes);
  if (0 < cgraph->n_nodes) {
    uVar7 = 0;
    do {
      pgVar5 = cgraph->nodes[uVar7];
      iVar1 = pgVar5->ne[0];
      iVar2 = pgVar5->ne[1];
      iVar3 = pgVar5->ne[2];
      pcVar4 = GGML_OP_NAME[pgVar5->op];
      pcVar6 = "x";
      if ((pgVar5->flags & 4) == 0) {
        pgVar5 = ggml_graph_get_grad(cgraph,pgVar5);
        pcVar6 = "g";
        if (pgVar5 == (ggml_tensor *)0x0) {
          pcVar6 = " ";
        }
      }
      ggml_log_internal(GGML_LOG_LEVEL_INFO," - %3d: [ %5ld, %5ld, %5ld] %16s %s\n",
                        uVar7 & 0xffffffff,iVar1,iVar2,iVar3,pcVar4,pcVar6);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)cgraph->n_nodes);
  }
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"n_leafs = %d\n",(ulong)(uint)cgraph->n_leafs);
  if (0 < cgraph->n_leafs) {
    uVar7 = 0;
    do {
      pgVar5 = cgraph->leafs[uVar7];
      ggml_log_internal(GGML_LOG_LEVEL_INFO," - %3d: [ %5ld, %5ld] %8s %16s\n",uVar7 & 0xffffffff,
                        pgVar5->ne[0],pgVar5->ne[1],GGML_OP_NAME[pgVar5->op],pgVar5->name);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)cgraph->n_leafs);
  }
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"========================================\n");
  return;
}

Assistant:

void ggml_graph_print(const struct ggml_cgraph * cgraph) {
    GGML_LOG_INFO("=== GRAPH ===\n");

    GGML_LOG_INFO("n_nodes = %d\n", cgraph->n_nodes);
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        GGML_LOG_INFO(" - %3d: [ %5" PRId64 ", %5" PRId64 ", %5" PRId64 "] %16s %s\n",
                i,
                node->ne[0], node->ne[1], node->ne[2],
                ggml_op_name(node->op), (node->flags & GGML_TENSOR_FLAG_PARAM) ? "x" :
                      ggml_graph_get_grad(cgraph, node) ? "g" : " ");
    }

    GGML_LOG_INFO("n_leafs = %d\n", cgraph->n_leafs);
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * node = cgraph->leafs[i];

        GGML_LOG_INFO(" - %3d: [ %5" PRId64 ", %5" PRId64 "] %8s %16s\n",
                i,
                node->ne[0], node->ne[1],
                ggml_op_name(node->op),
                ggml_get_name(node));
    }

    GGML_LOG_INFO("========================================\n");
}